

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

bool basist::transcode_uastc_to_bc7
               (unpacked_uastc_block *unpacked_src_blk,bc7_optimization_results *dst_blk)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [15];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [14];
  undefined1 auVar14 [15];
  undefined1 auVar15 [14];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [13];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [16];
  undefined1 auVar26 [15];
  unkuint9 Var27;
  undefined1 auVar28 [11];
  undefined1 auVar29 [14];
  undefined1 auVar30 [15];
  undefined1 auVar31 [11];
  undefined1 auVar32 [14];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  uint6 uVar37;
  uint8_t uVar38;
  bool bVar39;
  uint32_t i;
  uint32_t uVar40;
  long lVar41;
  long lVar42;
  uint8_t uVar43;
  uint uVar44;
  uint32_t i_12;
  uint uVar45;
  byte bVar46;
  uint uVar47;
  ulong unaff_RBP;
  uint8_t *puVar48;
  ulong uVar49;
  ulong uVar50;
  uint32_t i_14;
  ulong uVar51;
  uint32_t astc_comp;
  ulong uVar52;
  uint32_t i_15;
  uint uVar53;
  uint32_t i_17;
  uint32_t astc_subset;
  long lVar54;
  color_quad_u8 *pcVar55;
  uint32_t comp;
  undefined1 auVar56 [15];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [15];
  float best_err;
  float fVar64;
  float fVar65;
  int iVar66;
  float fVar67;
  int iVar70;
  float fVar71;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  color_quad_u8 bestMinColor;
  color_quad_u8 bestMaxColor;
  uint32_t best_pbits [2];
  float xh [4];
  float xl [4];
  color_quad_u8 bestMaxColor_4;
  color_quad_u8 bestMinColor_4;
  byte abStack_4c [4];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  dst_blk->m_pbits[2][0] = 0;
  dst_blk->m_pbits[2][1] = 0;
  dst_blk->m_index_selector = 0;
  dst_blk->m_rotation = 0;
  dst_blk->m_pbits[0][0] = 0;
  dst_blk->m_pbits[0][1] = 0;
  dst_blk->m_pbits[1][0] = 0;
  dst_blk->m_pbits[1][1] = 0;
  *(undefined4 *)dst_blk->m_low[2].m_c = 0;
  *(undefined4 *)dst_blk->m_high[0].m_c = 0;
  *(undefined4 *)dst_blk->m_high[1].m_c = 0;
  *(undefined4 *)dst_blk->m_high[2].m_c = 0;
  dst_blk->m_alpha_selectors[8] = '\0';
  dst_blk->m_alpha_selectors[9] = '\0';
  dst_blk->m_alpha_selectors[10] = '\0';
  dst_blk->m_alpha_selectors[0xb] = '\0';
  dst_blk->m_alpha_selectors[0xc] = '\0';
  dst_blk->m_alpha_selectors[0xd] = '\0';
  dst_blk->m_alpha_selectors[0xe] = '\0';
  dst_blk->m_alpha_selectors[0xf] = '\0';
  *(undefined4 *)dst_blk->m_low[0].m_c = 0;
  *(undefined4 *)dst_blk->m_low[1].m_c = 0;
  dst_blk->m_selectors[8] = '\0';
  dst_blk->m_selectors[9] = '\0';
  dst_blk->m_selectors[10] = '\0';
  dst_blk->m_selectors[0xb] = '\0';
  dst_blk->m_selectors[0xc] = '\0';
  dst_blk->m_selectors[0xd] = '\0';
  dst_blk->m_selectors[0xe] = '\0';
  dst_blk->m_selectors[0xf] = '\0';
  dst_blk->m_alpha_selectors[0] = '\0';
  dst_blk->m_alpha_selectors[1] = '\0';
  dst_blk->m_alpha_selectors[2] = '\0';
  dst_blk->m_alpha_selectors[3] = '\0';
  dst_blk->m_alpha_selectors[4] = '\0';
  dst_blk->m_alpha_selectors[5] = '\0';
  dst_blk->m_alpha_selectors[6] = '\0';
  dst_blk->m_alpha_selectors[7] = '\0';
  dst_blk->m_mode = 0;
  dst_blk->m_partition = 0;
  dst_blk->m_selectors[0] = '\0';
  dst_blk->m_selectors[1] = '\0';
  dst_blk->m_selectors[2] = '\0';
  dst_blk->m_selectors[3] = '\0';
  dst_blk->m_selectors[4] = '\0';
  dst_blk->m_selectors[5] = '\0';
  dst_blk->m_selectors[6] = '\0';
  dst_blk->m_selectors[7] = '\0';
  uVar44 = unpacked_src_blk->m_mode;
  uVar52 = (ulong)uVar44;
  if (uVar52 < 0x13) {
    bVar46 = g_uastc_mode_endpoint_ranges[uVar52];
    bVar1 = g_uastc_mode_comps[uVar52];
    uVar45 = (uint)CONCAT71(0x1cd2,bVar1);
    switch(uVar52) {
    default:
      dst_blk->m_mode = 6;
      xl[0] = (float)(byte)g_astc_unquant
                           [(ulong)(unpacked_src_blk->m_astc).m_endpoints[0] * 2 +
                            (ulong)bVar46 * 0x200] / 255.0;
      if (uVar52 - 0xf < 3) {
        xh[2] = (float)(byte)g_astc_unquant
                             [(ulong)(unpacked_src_blk->m_astc).m_endpoints[1] * 2 +
                              (ulong)bVar46 * 0x200] / 255.0;
        xl[1] = xl[0];
        xh[1] = xh[2];
        xh[0] = xh[2];
        xl[2] = xl[0];
        xl[3] = (float)(byte)g_astc_unquant
                             [(ulong)(unpacked_src_blk->m_astc).m_endpoints[2] * 2 +
                              (ulong)bVar46 * 0x200] / 255.0;
        xh[3] = (float)(byte)g_astc_unquant
                             [(ulong)(unpacked_src_blk->m_astc).m_endpoints[3] * 2 +
                              (ulong)bVar46 * 0x200] / 255.0;
        uVar45 = 4;
      }
      else {
        auVar57._0_4_ =
             (float)(byte)g_astc_unquant
                          [(ulong)(unpacked_src_blk->m_astc).m_endpoints[2] * 2 +
                           (ulong)bVar46 * 0x200];
        auVar57._4_4_ =
             (float)(byte)g_astc_unquant
                          [(ulong)(unpacked_src_blk->m_astc).m_endpoints[4] * 2 +
                           (ulong)bVar46 * 0x200];
        auVar57._8_8_ = 0;
        auVar58 = divps(auVar57,_DAT_001cc5f0);
        xl[1] = (float)(int)auVar58._0_8_;
        xl[2] = (float)(int)((ulong)auVar58._0_8_ >> 0x20);
        auVar59._0_4_ =
             (float)(byte)g_astc_unquant
                          [(ulong)(unpacked_src_blk->m_astc).m_endpoints[1] * 2 +
                           (ulong)bVar46 * 0x200];
        auVar59._4_4_ =
             (float)(byte)g_astc_unquant
                          [(ulong)(unpacked_src_blk->m_astc).m_endpoints[3] * 2 +
                           (ulong)bVar46 * 0x200];
        auVar59._8_8_ = 0;
        auVar58 = divps(auVar59,_DAT_001cc5f0);
        xh._0_8_ = auVar58._0_8_;
        xh[2] = (float)(byte)g_astc_unquant
                             [(ulong)(unpacked_src_blk->m_astc).m_endpoints[5] * 2 +
                              (ulong)bVar46 * 0x200] / 255.0;
        if (uVar52 - 8 < 7) {
          xl[3] = (float)(byte)g_astc_unquant
                               [(ulong)(unpacked_src_blk->m_astc).m_endpoints[6] * 2 +
                                (ulong)bVar46 * 0x200] / 255.0;
          xh[3] = (float)(byte)g_astc_unquant
                               [(ulong)(unpacked_src_blk->m_astc).m_endpoints[7] * 2 +
                                (ulong)bVar46 * 0x200] / 255.0;
        }
        else {
          xl[3] = 1.0;
          xh[3] = 1.0;
        }
      }
      determine_unique_pbits(uVar45 & 0xff,7,xl,xh,&bestMinColor,&bestMaxColor,best_pbits);
      *&dst_blk->m_low[0].m_c = bestMinColor.m_c;
      *&dst_blk->m_high[0].m_c = bestMaxColor.m_c;
      if (uVar52 - 0x12 < 0xfffffffffffffff6) {
        dst_blk->m_low[0].m_c[3] = '\x7f';
        dst_blk->m_high[0].m_c[3] = '\x7f';
      }
      dst_blk->m_pbits[0] = best_pbits;
      if ((uVar52 == 5) || (uVar44 == 0xc)) {
        for (lVar42 = 0; lVar42 != 0x10; lVar42 = lVar42 + 1) {
          dst_blk->m_selectors[lVar42] =
               (&DAT_0024edf8)[(unpacked_src_blk->m_astc).m_weights[lVar42]];
        }
      }
      else {
        lVar42 = 0;
        if (uVar44 == 0x12) {
          for (; lVar42 != 0x10; lVar42 = lVar42 + 1) {
            dst_blk->m_selectors[lVar42] =
                 (&DAT_0024ee30)[(unpacked_src_blk->m_astc).m_weights[lVar42]];
          }
        }
        else if (uVar44 == 0xe) {
          for (; lVar42 != 0x10; lVar42 = lVar42 + 1) {
            dst_blk->m_selectors[lVar42] =
                 (&DAT_001cc7b0)[(unpacked_src_blk->m_astc).m_weights[lVar42]];
          }
        }
        else {
          for (; lVar42 != 0x10; lVar42 = lVar42 + 1) {
            dst_blk->m_selectors[lVar42] = (unpacked_src_blk->m_astc).m_weights[lVar42];
          }
        }
      }
      break;
    case 1:
      dst_blk->m_mode = 3;
      auVar6 = DAT_001cc630._0_15_;
      auVar58 = psllw(ZEXT116((unpacked_src_blk->m_astc).m_endpoints[2]),8);
      auVar63 = ~auVar6 & auVar58._0_15_ |
                SUB1615(*(undefined1 (*) [16])(unpacked_src_blk->m_astc).m_endpoints,0) & auVar6;
      auVar56[0xd] = 0;
      auVar56._0_13_ = auVar63._0_13_;
      auVar56[0xe] = auVar63[7];
      auVar9[0xc] = auVar63[6];
      auVar9._0_12_ = auVar63._0_12_;
      auVar9._13_2_ = auVar56._13_2_;
      auVar10[0xb] = 0;
      auVar10._0_11_ = auVar63._0_11_;
      auVar10._12_3_ = auVar9._12_3_;
      auVar12[10] = auVar63[5];
      auVar12._0_10_ = auVar63._0_10_;
      auVar12._11_4_ = auVar10._11_4_;
      auVar16[9] = 0;
      auVar16._0_9_ = auVar63._0_9_;
      auVar16._10_5_ = auVar12._10_5_;
      auVar18[8] = auVar63[4];
      auVar18._0_8_ = auVar63._0_8_;
      auVar18._9_6_ = auVar16._9_6_;
      auVar26._7_8_ = 0;
      auVar26._0_7_ = auVar18._8_7_;
      Var27 = CONCAT81(SUB158(auVar26 << 0x40,7),auVar63[3]);
      auVar33._9_6_ = 0;
      auVar33._0_9_ = Var27;
      auVar28._1_10_ = SUB1510(auVar33 << 0x30,5);
      auVar28[0] = auVar63[2];
      auVar34._11_4_ = 0;
      auVar34._0_11_ = auVar28;
      auVar21[2] = auVar63[1];
      auVar21._0_2_ = auVar63._0_2_;
      auVar21._3_12_ = SUB1512(auVar34 << 0x20,3);
      auVar23._2_13_ = auVar21._2_13_;
      auVar23._0_2_ = auVar63._0_2_ & 0xff;
      auVar7._10_2_ = 0;
      auVar7._0_10_ = auVar23._0_10_;
      auVar7._12_2_ = (short)Var27;
      uVar37 = CONCAT42(auVar7._10_4_,auVar28._0_2_);
      auVar29._6_8_ = 0;
      auVar29._0_6_ = uVar37;
      auVar13._4_2_ = auVar21._2_2_;
      auVar13._0_4_ = auVar23._0_4_;
      auVar13._6_8_ = SUB148(auVar29 << 0x40,6);
      auVar62._0_4_ = (float)(auVar23._0_4_ & 0xffff);
      auVar62._4_4_ = (float)auVar13._4_4_;
      auVar62._8_4_ = (float)(int)uVar37;
      auVar62._12_4_ = (float)(auVar7._10_4_ >> 0x10);
      auVar58 = divps(auVar62,_DAT_001cc5f0);
      xl[2] = (float)(unpacked_src_blk->m_astc).m_endpoints[4] / 255.0;
      xl[0] = (float)(int)auVar58._0_8_;
      xl[1] = (float)(int)((ulong)auVar58._0_8_ >> 0x20);
      xl[3] = 1.0;
      auVar58 = psllw(ZEXT416(*(uint *)((unpacked_src_blk->m_astc).m_endpoints + 3)),8);
      auVar56 = ~auVar6 & auVar58._0_15_ |
                SUB1615(*(undefined1 (*) [16])((unpacked_src_blk->m_astc).m_endpoints + 1),0) &
                auVar6;
      auVar6[0xd] = 0;
      auVar6._0_13_ = auVar56._0_13_;
      auVar6[0xe] = auVar56[7];
      auVar63[0xc] = auVar56[6];
      auVar63._0_12_ = auVar56._0_12_;
      auVar63._13_2_ = auVar6._13_2_;
      auVar11[0xb] = 0;
      auVar11._0_11_ = auVar56._0_11_;
      auVar11._12_3_ = auVar63._12_3_;
      auVar14[10] = auVar56[5];
      auVar14._0_10_ = auVar56._0_10_;
      auVar14._11_4_ = auVar11._11_4_;
      auVar17[9] = 0;
      auVar17._0_9_ = auVar56._0_9_;
      auVar17._10_5_ = auVar14._10_5_;
      auVar19[8] = auVar56[4];
      auVar19._0_8_ = auVar56._0_8_;
      auVar19._9_6_ = auVar17._9_6_;
      auVar30._7_8_ = 0;
      auVar30._0_7_ = auVar19._8_7_;
      Var27 = CONCAT81(SUB158(auVar30 << 0x40,7),auVar56[3]);
      auVar35._9_6_ = 0;
      auVar35._0_9_ = Var27;
      auVar31._1_10_ = SUB1510(auVar35 << 0x30,5);
      auVar31[0] = auVar56[2];
      auVar36._11_4_ = 0;
      auVar36._0_11_ = auVar31;
      auVar22[2] = auVar56[1];
      auVar22._0_2_ = auVar56._0_2_;
      auVar22._3_12_ = SUB1512(auVar36 << 0x20,3);
      auVar24._2_13_ = auVar22._2_13_;
      auVar24._0_2_ = auVar56._0_2_ & 0xff;
      auVar8._10_2_ = 0;
      auVar8._0_10_ = auVar24._0_10_;
      auVar8._12_2_ = (short)Var27;
      uVar37 = CONCAT42(auVar8._10_4_,auVar31._0_2_);
      auVar32._6_8_ = 0;
      auVar32._0_6_ = uVar37;
      auVar15._4_2_ = auVar22._2_2_;
      auVar15._0_4_ = auVar24._0_4_;
      auVar15._6_8_ = SUB148(auVar32 << 0x40,6);
      auVar61._0_4_ = (float)(auVar24._0_4_ & 0xffff);
      auVar61._4_4_ = (float)auVar15._4_4_;
      auVar61._8_4_ = (float)(int)uVar37;
      auVar61._12_4_ = (float)(auVar8._10_4_ >> 0x10);
      auVar58 = divps(auVar61,_DAT_001cc5f0);
      xh._0_8_ = auVar58._0_8_;
      xh[2] = (float)(unpacked_src_blk->m_astc).m_endpoints[5] / 255.0;
      xh[3] = 1.0;
      bestMinColor.m_c[0] = '\0';
      bestMinColor.m_c[1] = '\0';
      bestMinColor.m_c[2] = '\0';
      bestMinColor.m_c[3] = '\0';
      bestMaxColor.m_c[0] = '\0';
      bestMaxColor.m_c[1] = '\0';
      bestMaxColor.m_c[2] = '\0';
      bestMaxColor.m_c[3] = '\0';
      determine_unique_pbits(3,7,xl,xh,&bestMinColor,&bestMaxColor,best_pbits);
      for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
        uVar38 = bestMinColor.m_c[lVar42];
        dst_blk->m_low[0].m_c[lVar42] = uVar38;
        uVar43 = bestMaxColor.m_c[lVar42];
        dst_blk->m_high[0].m_c[lVar42] = uVar43;
        dst_blk->m_low[1].m_c[lVar42] = uVar38;
        dst_blk->m_high[1].m_c[lVar42] = uVar43;
      }
      dst_blk->m_pbits[0][0] = best_pbits[0];
      dst_blk->m_pbits[0][1] = best_pbits[1];
      dst_blk->m_pbits[1][0] = best_pbits[0];
      dst_blk->m_pbits[1][1] = best_pbits[1];
      for (lVar42 = 0; lVar42 != 0x10; lVar42 = lVar42 + 1) {
        dst_blk->m_selectors[lVar42] = (unpacked_src_blk->m_astc).m_weights[lVar42];
      }
      break;
    case 2:
      dst_blk->m_mode = 1;
      dst_blk->m_partition =
           (uint)(byte)g_astc_bc7_common_partitions2[(ulong)unpacked_src_blk->m_common_pattern * 6];
      auVar58 = _DAT_001cc5f0;
      cVar2 = g_astc_bc7_common_partitions2[(ulong)unpacked_src_blk->m_common_pattern * 6 + 4];
      xl[3] = 1.0;
      xh[3] = 1.0;
      puVar48 = (unpacked_src_blk->m_astc).m_endpoints + 1;
      for (lVar42 = 0; lVar42 != 2; lVar42 = lVar42 + 1) {
        for (lVar54 = 0; lVar54 != 3; lVar54 = lVar54 + 1) {
          xl[lVar54] = (float)((uint)puVar48[lVar54 * 2 + -1] << 4 | (uint)puVar48[lVar54 * 2 + -1])
                       / 255.0;
          xh[lVar54] = (float)((uint)puVar48[lVar54 * 2] << 4 | (uint)puVar48[lVar54 * 2]) / 255.0;
        }
        bestMinColor_4.m_c[0] = '\0';
        bestMinColor_4.m_c[1] = '\0';
        bestMinColor_4.m_c[2] = '\0';
        bestMinColor_4.m_c[3] = '\0';
        bestMaxColor_4.m_c[0] = '\0';
        bestMaxColor_4.m_c[1] = '\0';
        bestMaxColor_4.m_c[2] = '\0';
        bestMaxColor_4.m_c[3] = '\0';
        uVar40 = 0;
        fVar64 = 1e+09;
        for (uVar44 = 0; uVar44 != 2; uVar44 = uVar44 + 1) {
          uVar45 = uVar44 | 0x7e;
          for (lVar54 = 0; lVar54 != 4; lVar54 = lVar54 + 1) {
            iVar66 = (int)((xh[lVar54] * 127.0 - (float)(int)uVar44) * 0.5 + 0.5);
            iVar70 = (int)((xl[lVar54] * 127.0 - (float)(int)uVar44) * 0.5 + 0.5);
            uVar53 = uVar44 + iVar70 * 2;
            if ((int)uVar45 <= (int)uVar53) {
              uVar53 = uVar45;
            }
            auVar5._4_4_ = iVar66;
            auVar5._0_4_ = iVar66;
            auVar5._8_4_ = iVar70;
            auVar5._12_4_ = iVar70;
            uVar47 = movmskpd((int)unaff_RBP,auVar5);
            unaff_RBP = (ulong)uVar47;
            uVar43 = (uint8_t)uVar44;
            uVar38 = uVar43;
            if ((uVar47 & 2) == 0) {
              uVar38 = (uint8_t)uVar53;
            }
            *(uint8_t *)((long)best_pbits + lVar54) = uVar38;
            uVar53 = uVar44 + iVar66 * 2;
            if ((int)uVar45 <= (int)uVar53) {
              uVar53 = uVar45;
            }
            if ((uVar47 & 1) == 0) {
              uVar43 = (uint8_t)uVar53;
            }
            bestMinColor.m_c[lVar54] = uVar43;
          }
          for (lVar54 = 0; lVar54 != 4; lVar54 = lVar54 + 1) {
            bVar46 = *(char *)((long)best_pbits + lVar54) * '\x02';
            bestMaxColor.m_c[lVar54] = bVar46 >> 7 | bVar46;
            bVar46 = bestMinColor.m_c[lVar54] * '\x02';
            bVar46 = bVar46 >> 7 | bVar46;
            unaff_RBP = (ulong)bVar46;
            abStack_4c[lVar54] = bVar46;
          }
          fVar65 = 0.0;
          for (lVar54 = 0; lVar54 != 3; lVar54 = lVar54 + 1) {
            unaff_RBP = (ulong)abStack_4c[lVar54];
            auVar68._0_4_ = (float)bestMaxColor.m_c[lVar54];
            auVar68._4_4_ = (float)abStack_4c[lVar54];
            auVar68._8_8_ = 0;
            auVar69 = divps(auVar68,auVar58);
            fVar67 = auVar69._0_4_ - xl[lVar54];
            fVar71 = auVar69._4_4_ - xh[lVar54];
            fVar65 = fVar65 + fVar71 * fVar71 + fVar67 * fVar67;
          }
          if (fVar65 < fVar64) {
            for (lVar54 = 0; fVar64 = fVar65, uVar40 = uVar44, lVar54 != 4; lVar54 = lVar54 + 1) {
              bestMinColor_4.m_c[lVar54] = *(byte *)((long)best_pbits + lVar54) >> 1;
              bestMaxColor_4.m_c[lVar54] = bestMinColor.m_c[lVar54] >> 1;
            }
          }
        }
        uVar44 = 1 - (uint)lVar42;
        if (cVar2 == '\0') {
          uVar44 = (uint)lVar42;
        }
        for (lVar54 = 0; lVar54 != 3; lVar54 = lVar54 + 1) {
          dst_blk->m_low[uVar44].m_c[lVar54] = bestMinColor_4.m_c[lVar54];
          unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),bestMaxColor_4.m_c[lVar54]);
          dst_blk->m_high[uVar44].m_c[lVar54] = bestMaxColor_4.m_c[lVar54];
        }
        dst_blk->m_pbits[uVar44][0] = uVar40;
        puVar48 = puVar48 + 6;
      }
      for (lVar42 = 0; lVar42 != 0x10; lVar42 = lVar42 + 1) {
        dst_blk->m_selectors[lVar42] = (unpacked_src_blk->m_astc).m_weights[lVar42];
      }
      break;
    case 3:
      dst_blk->m_mode = 2;
      dst_blk->m_partition =
           (uint)(byte)g_astc_bc7_common_partitions3[(ulong)unpacked_src_blk->m_common_pattern * 6];
      bVar1 = g_astc_bc7_common_partitions3[(ulong)unpacked_src_blk->m_common_pattern * 6 + 4];
      puVar48 = (unpacked_src_blk->m_astc).m_endpoints + 1;
      for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
        bVar3 = g_astc_to_bc7_partition_index_perm_tables[lVar42 + (ulong)bVar1 * 3];
        for (lVar54 = 0; lVar54 != 3; lVar54 = lVar54 + 1) {
          bVar4 = g_astc_unquant[(ulong)puVar48[lVar54 * 2] * 2 + (ulong)bVar46 * 0x200];
          dst_blk->m_low[bVar3].m_c[lVar54] =
               (uint8_t)(((uint)(byte)g_astc_unquant
                                      [(ulong)puVar48[lVar54 * 2 + -1] * 2 + (ulong)bVar46 * 0x200]
                          * 0x1f + 0x7f) / 0xff);
          dst_blk->m_high[bVar3].m_c[lVar54] = (uint8_t)(((uint)bVar4 * 0x1f + 0x7f) / 0xff);
        }
        puVar48 = puVar48 + 6;
      }
      for (lVar42 = 0; lVar42 != 0x10; lVar42 = lVar42 + 1) {
        dst_blk->m_selectors[lVar42] = (unpacked_src_blk->m_astc).m_weights[lVar42];
      }
      break;
    case 4:
      dst_blk->m_mode = 3;
      dst_blk->m_partition =
           (uint)(byte)g_astc_bc7_common_partitions2[(ulong)unpacked_src_blk->m_common_pattern * 6];
      cVar2 = g_astc_bc7_common_partitions2[(ulong)unpacked_src_blk->m_common_pattern * 6 + 4];
      xl[3] = 1.0;
      xh[3] = 1.0;
      puVar48 = (unpacked_src_blk->m_astc).m_endpoints + 1;
      for (lVar42 = 0; lVar54 = 0, lVar42 != 2; lVar42 = lVar42 + 1) {
        for (; lVar54 != 3; lVar54 = lVar54 + 1) {
          xl[lVar54] = (float)(byte)g_astc_unquant
                                    [(ulong)puVar48[lVar54 * 2 + -1] * 2 + (ulong)bVar46 * 0x200] /
                       255.0;
          xh[lVar54] = (float)(byte)g_astc_unquant
                                    [(ulong)puVar48[lVar54 * 2] * 2 + (ulong)bVar46 * 0x200] / 255.0
          ;
        }
        best_pbits[0] = 0;
        best_pbits[1] = 0;
        bestMinColor.m_c[0] = '\0';
        bestMinColor.m_c[1] = '\0';
        bestMinColor.m_c[2] = '\0';
        bestMinColor.m_c[3] = '\0';
        bestMaxColor.m_c[0] = '\0';
        bestMaxColor.m_c[1] = '\0';
        bestMaxColor.m_c[2] = '\0';
        bestMaxColor.m_c[3] = '\0';
        determine_unique_pbits(3,7,xl,xh,&bestMinColor,&bestMaxColor,best_pbits);
        uVar44 = 1 - (uint)lVar42;
        if (cVar2 == '\0') {
          uVar44 = (uint)lVar42;
        }
        for (lVar54 = 0; lVar54 != 3; lVar54 = lVar54 + 1) {
          dst_blk->m_low[uVar44].m_c[lVar54] = bestMinColor.m_c[lVar54];
          dst_blk->m_high[uVar44].m_c[lVar54] = bestMaxColor.m_c[lVar54];
        }
        dst_blk->m_low[uVar44].m_c[3] = '\x7f';
        dst_blk->m_high[uVar44].m_c[3] = '\x7f';
        dst_blk->m_pbits[uVar44] = best_pbits;
        puVar48 = puVar48 + 6;
      }
      for (; lVar54 != 0x10; lVar54 = lVar54 + 1) {
        dst_blk->m_selectors[lVar54] = (unpacked_src_blk->m_astc).m_weights[lVar54];
      }
      break;
    case 6:
    case 0xb:
    case 0xd:
    case 0x11:
      dst_blk->m_mode = 5;
      dst_blk->m_rotation = (unpacked_src_blk->m_astc).m_ccs + 1U & 3;
      if (uVar52 - 0xf < 3) {
        if ((unpacked_src_blk->m_astc).m_ccs != 3) {
          __assert_fail("unpacked_src_blk.m_astc.m_ccs == 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                        ,0x3379,
                        "bool basist::transcode_uastc_to_bc7(const unpacked_uastc_block &, bc7_optimization_results &)"
                       );
        }
        uVar43 = (uint8_t)(((uint)(byte)g_astc_unquant
                                        [(ulong)(unpacked_src_blk->m_astc).m_endpoints[0] * 2 +
                                         (ulong)bVar46 * 0x200] * 0x7f + 0x7f) / 0xff);
        dst_blk->m_low[0].m_c[0] = uVar43;
        uVar38 = (uint8_t)(((uint)(byte)g_astc_unquant
                                        [(ulong)(unpacked_src_blk->m_astc).m_endpoints[1] * 2 +
                                         (ulong)bVar46 * 0x200] * 0x7f + 0x7f) / 0xff);
        dst_blk->m_high[0].m_c[0] = uVar38;
        dst_blk->m_low[0].m_c[1] = uVar43;
        dst_blk->m_high[0].m_c[1] = uVar38;
        dst_blk->m_low[0].m_c[2] = uVar43;
        dst_blk->m_high[0].m_c[2] = uVar38;
        dst_blk->m_low[0].m_c[3] =
             g_astc_unquant
             [(ulong)(unpacked_src_blk->m_astc).m_endpoints[2] * 2 + (ulong)bVar46 * 0x200];
        dst_blk->m_high[0].m_c[3] =
             g_astc_unquant
             [(ulong)(unpacked_src_blk->m_astc).m_endpoints[3] * 2 + (ulong)bVar46 * 0x200];
      }
      else {
        for (uVar52 = 0; uVar52 != 4; uVar52 = uVar52 + 1) {
          uVar45 = (unpacked_src_blk->m_astc).m_ccs;
          uVar53 = (uint)uVar52;
          if (uVar52 == 3) {
            uVar53 = uVar45;
          }
          if (uVar52 == uVar45) {
            uVar53 = 3;
          }
          uVar45 = 0xff;
          uVar47 = 0xff;
          if (uVar52 < bVar1) {
            uVar45 = (uint)(byte)g_astc_unquant
                                 [(ulong)(unpacked_src_blk->m_astc).m_endpoints[uVar52 * 2] * 2 +
                                  (ulong)bVar46 * 0x200];
            uVar47 = (uint)(byte)g_astc_unquant
                                 [(ulong)(unpacked_src_blk->m_astc).m_endpoints[uVar52 * 2 + 1] * 2
                                  + (ulong)bVar46 * 0x200];
          }
          if (uVar53 < 3) {
            uVar45 = (uVar45 * 0x7f + 0x7f) / 0xff;
            uVar47 = (uVar47 * 0x7f + 0x7f) / 0xff;
          }
          dst_blk->m_low[0].m_c[uVar53] = (uint8_t)uVar45;
          dst_blk->m_high[0].m_c[uVar53] = (uint8_t)uVar47;
        }
      }
      lVar42 = 0;
      if (uVar44 == 0xd) {
        for (; lVar42 != 0x10; lVar42 = lVar42 + 1) {
          dst_blk->m_selectors[lVar42] =
               ((unpacked_src_blk->m_astc).m_weights[lVar42 * 2] != '\0') * '\x03';
          dst_blk->m_alpha_selectors[lVar42] =
               ((unpacked_src_blk->m_astc).m_weights[lVar42 * 2 + 1] != '\0') * '\x03';
        }
      }
      else {
        for (; lVar42 != 0x10; lVar42 = lVar42 + 1) {
          dst_blk->m_selectors[lVar42] = (unpacked_src_blk->m_astc).m_weights[lVar42 * 2];
          dst_blk->m_alpha_selectors[lVar42] = (unpacked_src_blk->m_astc).m_weights[lVar42 * 2 + 1];
        }
      }
      break;
    case 7:
      dst_blk->m_mode = 2;
      dst_blk->m_partition =
           (uint)(byte)g_bc7_3_astc2_common_partitions
                       [(ulong)unpacked_src_blk->m_common_pattern * 6];
      bVar1 = g_bc7_3_astc2_common_partitions[(ulong)unpacked_src_blk->m_common_pattern * 6 + 4];
      pcVar55 = dst_blk->m_high;
      for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
        uVar40 = bc7_convert_partition_index_3_to_2((uint32_t)lVar42,(uint)bVar1);
        for (lVar54 = 0; lVar54 != 3; lVar54 = lVar54 + 1) {
          pcVar55[-3].m_c[lVar54] =
               (uint8_t)(((uint)(byte)g_astc_unquant
                                      [(ulong)(unpacked_src_blk->m_astc).m_endpoints
                                              [lVar54 * 2 + (ulong)(uVar40 * 6)] * 2 +
                                       (ulong)bVar46 * 0x200] * 0x1f + 0x7f) / 0xff);
          pcVar55->m_c[lVar54] =
               (uint8_t)(((uint)(byte)g_astc_unquant
                                      [(ulong)(unpacked_src_blk->m_astc).m_endpoints
                                              [lVar54 * 2 + (ulong)(uVar40 * 6) + 1] * 2 +
                                       (ulong)bVar46 * 0x200] * 0x1f + 0x7f) / 0xff);
        }
        pcVar55 = pcVar55 + 1;
      }
      for (lVar42 = 0; lVar42 != 0x10; lVar42 = lVar42 + 1) {
        dst_blk->m_selectors[lVar42] = (unpacked_src_blk->m_astc).m_weights[lVar42];
      }
      break;
    case 8:
      uVar52 = (ulong)(unpacked_src_blk->m_solid_color).field_0.field_0.r;
      uVar49 = (ulong)(unpacked_src_blk->m_solid_color).field_0.field_0.g;
      uVar51 = (ulong)(unpacked_src_blk->m_solid_color).field_0.field_0.b;
      uVar50 = (ulong)(unpacked_src_blk->m_solid_color).field_0.field_0.a;
      uVar45 = (uint)*(ushort *)(&DAT_00288d74 + uVar50 * 8) +
               (uint)*(ushort *)(&DAT_00288d74 + uVar51 * 8) +
               (uint)*(ushort *)(&DAT_00288d74 + uVar49 * 8) +
               (uint)*(ushort *)(&DAT_00288d74 + uVar52 * 8);
      uVar44 = (uint)(ushort)(&g_bc7_mode_6_optimal_endpoints)[uVar50 * 4] +
               (uint)(ushort)(&g_bc7_mode_6_optimal_endpoints)[uVar51 * 4] +
               (uint)(ushort)(&g_bc7_mode_6_optimal_endpoints)[uVar49 * 4] +
               (uint)(ushort)(&g_bc7_mode_6_optimal_endpoints)[uVar52 * 4];
      if ((uVar44 == 0) || (uVar45 == 0)) {
        dst_blk->m_mode = 6;
        lVar42 = (ulong)(uVar45 < uVar44) * 4;
        for (lVar54 = 0; lVar54 != 4; lVar54 = lVar54 + 1) {
          dst_blk->m_low[0].m_c[lVar54] =
               (&DAT_00288d72)
               [lVar42 + (ulong)*(byte *)((long)(&unpacked_src_blk->m_astc + 1) + lVar54 + 8) * 8];
          dst_blk->m_high[0].m_c[lVar54] =
               (&DAT_00288d73)
               [lVar42 + (ulong)*(byte *)((long)(&unpacked_src_blk->m_astc + 1) + lVar54 + 8) * 8];
        }
        dst_blk->m_pbits[0][0] = (uint)(uVar45 < uVar44);
        dst_blk->m_pbits[0][1] = (uint)(uVar45 < uVar44);
        builtin_memcpy(dst_blk->m_selectors,
                       "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05",0x10);
      }
      else {
        dst_blk->m_mode = 5;
        for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
          dst_blk->m_low[0].m_c[lVar42] =
               (&DAT_00289572)
               [(ulong)*(byte *)((long)(&unpacked_src_blk->m_astc + 1) + lVar42 + 8) * 4];
          dst_blk->m_high[0].m_c[lVar42] =
               (&DAT_00289573)
               [(ulong)*(byte *)((long)(&unpacked_src_blk->m_astc + 1) + lVar42 + 8) * 4];
        }
        builtin_memcpy(dst_blk->m_selectors,
                       "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
        uVar38 = (unpacked_src_blk->m_solid_color).field_0.field_0.a;
        dst_blk->m_low[0].m_c[3] = uVar38;
        dst_blk->m_high[0].m_c[3] = uVar38;
      }
      break;
    case 9:
    case 0x10:
      dst_blk->m_mode = 7;
      dst_blk->m_partition =
           (uint)(byte)g_astc_bc7_common_partitions2[(ulong)unpacked_src_blk->m_common_pattern * 6];
      cVar2 = g_astc_bc7_common_partitions2[(ulong)unpacked_src_blk->m_common_pattern * 6 + 4];
      uVar44 = 1;
      lVar42 = 3;
      local_48 = 0x437f0000;
      uStack_44 = 0x437f0000;
      uStack_40 = 0x437f0000;
      uStack_3c = 0x437f0000;
      for (lVar54 = 0; lVar54 != 2; lVar54 = lVar54 + 1) {
        if (uVar52 - 0xf < 3) {
          xh[2] = (float)(byte)g_astc_unquant
                               [(ulong)(unpacked_src_blk->m_astc).m_endpoints[lVar54 * 4 + 1] * 2 +
                                (ulong)bVar46 * 0x200] / 255.0;
          xh[1] = xh[2];
          xh[0] = xh[2];
          auVar60._0_4_ =
               (float)(byte)g_astc_unquant
                            [(ulong)(unpacked_src_blk->m_astc).m_endpoints[lVar54 * 4] * 2 +
                             (ulong)bVar46 * 0x200];
          auVar60._4_4_ = auVar60._0_4_;
          auVar60._8_4_ = auVar60._0_4_;
          auVar60._12_4_ =
               (float)(byte)g_astc_unquant
                            [(ulong)(unpacked_src_blk->m_astc).m_endpoints[lVar54 * 4 + 2] * 2 +
                             (ulong)bVar46 * 0x200];
          auVar25._4_4_ = uStack_44;
          auVar25._0_4_ = local_48;
          auVar25._8_4_ = uStack_40;
          auVar25._12_4_ = uStack_3c;
          xl = (float  [4])divps(auVar60,auVar25);
          lVar41 = lVar42;
        }
        else {
          auVar20[0xc] = g_astc_unquant
                         [(ulong)(unpacked_src_blk->m_astc).m_endpoints[lVar54 * 8 + 6] * 2 +
                          (ulong)bVar46 * 0x200];
          auVar20._0_12_ = ZEXT712(0);
          auVar58._0_4_ =
               (float)(byte)g_astc_unquant
                            [(ulong)(unpacked_src_blk->m_astc).m_endpoints[lVar54 * 8] * 2 +
                             (ulong)bVar46 * 0x200];
          auVar58._4_4_ =
               (float)(byte)g_astc_unquant
                            [(ulong)(unpacked_src_blk->m_astc).m_endpoints[lVar54 * 8 + 2] * 2 +
                             (ulong)bVar46 * 0x200];
          auVar58._8_4_ =
               (float)(int)CONCAT32(auVar20._10_3_,
                                    (ushort)(byte)g_astc_unquant
                                                  [(ulong)(unpacked_src_blk->m_astc).m_endpoints
                                                          [lVar54 * 8 + 4] * 2 +
                                                   (ulong)bVar46 * 0x200]);
          auVar58._12_4_ = (float)(uint3)(auVar20._10_3_ >> 0x10);
          xl = (float  [4])divps(auVar58,_DAT_001cc5e0);
          auVar69._0_4_ =
               (float)(byte)g_astc_unquant
                            [(ulong)(unpacked_src_blk->m_astc).m_endpoints[lVar54 * 8 + 1] * 2 +
                             (ulong)bVar46 * 0x200];
          auVar69._4_4_ =
               (float)(byte)g_astc_unquant
                            [(ulong)(unpacked_src_blk->m_astc).m_endpoints[lVar54 * 8 + 3] * 2 +
                             (ulong)bVar46 * 0x200];
          auVar69._8_8_ = 0;
          auVar58 = divps(auVar69,_DAT_001cc5f0);
          xh._0_8_ = auVar58._0_8_;
          xh[2] = (float)(byte)g_astc_unquant
                               [(ulong)(unpacked_src_blk->m_astc).m_endpoints[lVar54 * 8 + 5] * 2 +
                                (ulong)bVar46 * 0x200] / 255.0;
          lVar41 = lVar54 * 8 + 7;
        }
        best_pbits[0] = 0;
        best_pbits[1] = 0;
        xh[3] = (float)(byte)g_astc_unquant
                             [(ulong)(unpacked_src_blk->m_astc).m_endpoints[lVar41] * 2 +
                              (ulong)bVar46 * 0x200] / 255.0;
        bestMinColor.m_c[0] = '\0';
        bestMinColor.m_c[1] = '\0';
        bestMinColor.m_c[2] = '\0';
        bestMinColor.m_c[3] = '\0';
        bestMaxColor.m_c[0] = '\0';
        bestMaxColor.m_c[1] = '\0';
        bestMaxColor.m_c[2] = '\0';
        bestMaxColor.m_c[3] = '\0';
        determine_unique_pbits(4,5,xl,xh,&bestMinColor,&bestMaxColor,best_pbits);
        uVar45 = (uint)lVar54;
        if (cVar2 != '\0') {
          uVar45 = uVar44;
        }
        *&dst_blk->m_low[uVar45].m_c = bestMinColor.m_c;
        *&dst_blk->m_high[uVar45].m_c = bestMaxColor.m_c;
        dst_blk->m_pbits[uVar45] = best_pbits;
        uVar44 = uVar44 - 1;
        lVar42 = lVar42 + 4;
      }
      for (lVar42 = 0; lVar42 != 0x10; lVar42 = lVar42 + 1) {
        dst_blk->m_selectors[lVar42] = (unpacked_src_blk->m_astc).m_weights[lVar42];
      }
    }
    bVar39 = true;
  }
  else {
    bVar39 = false;
  }
  return bVar39;
}

Assistant:

bool transcode_uastc_to_bc7(const unpacked_uastc_block& unpacked_src_blk, bc7_optimization_results& dst_blk)
	{
		memset(&dst_blk, 0, sizeof(dst_blk));

		const uint32_t mode = unpacked_src_blk.m_mode;

		const uint32_t endpoint_range = g_uastc_mode_endpoint_ranges[mode];
		const uint32_t total_comps = g_uastc_mode_comps[mode];

		switch (mode)
		{
		case 0:
		case 5:
		case 10:
		case 12:
		case 14:
		case 15:
		case 18:
		{
			// MODE 0: DualPlane: 0, WeightRange: 8 (16), Subsets: 1, EndpointRange: 19 (192) - BC7 MODE6 RGB
			// MODE 5: DualPlane: 0, WeightRange : 5 (8), Subsets : 1, EndpointRange : 20 (256) - BC7 MODE6 RGB
			// MODE 10 DualPlane: 0, WeightRange: 8 (16), Subsets: 1, EndpointRange: 13 (48) - BC7 MODE6
			// MODE 12: DualPlane: 0, WeightRange : 5 (8), Subsets : 1, EndpointRange : 19 (192) - BC7 MODE6
			// MODE 14: DualPlane: 0, WeightRange : 2 (4), Subsets : 1, EndpointRange : 20 (256) - BC7 MODE6
			// MODE 18: DualPlane: 0, WeightRange : 11 (32), Subsets : 1, CEM : 8, EndpointRange : 11 (32) - BC7 MODE6
			// MODE 15: DualPlane: 0, WeightRange : 8 (16), Subsets : 1, CEM : 4 (LA Direct), EndpointRange : 20 (256) - BC7 MODE6
			dst_blk.m_mode = 6;

			float xl[4], xh[4];
			if (total_comps == 2)
			{
				xl[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0]].m_unquant / 255.0f;
				xh[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1]].m_unquant / 255.0f;

				xl[1] = xl[0];
				xh[1] = xh[0];

				xl[2] = xl[0];
				xh[2] = xh[0];

				xl[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2]].m_unquant / 255.0f;
				xh[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3]].m_unquant / 255.0f;
			}
			else
			{
				xl[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0]].m_unquant / 255.0f;
				xl[1] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2]].m_unquant / 255.0f;
				xl[2] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[4]].m_unquant / 255.0f;

				xh[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1]].m_unquant / 255.0f;
				xh[1] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3]].m_unquant / 255.0f;
				xh[2] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[5]].m_unquant / 255.0f;

				if (total_comps == 4)
				{
					xl[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[6]].m_unquant / 255.0f;
					xh[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[7]].m_unquant / 255.0f;
				}
				else
				{
					xl[3] = 1.0f;
					xh[3] = 1.0f;
				}
			}

			uint32_t best_pbits[2];
			color_quad_u8 bestMinColor, bestMaxColor;
			determine_unique_pbits((total_comps == 2) ? 4 : total_comps, 7, xl, xh, bestMinColor, bestMaxColor, best_pbits);

			dst_blk.m_low[0] = bestMinColor;
			dst_blk.m_high[0] = bestMaxColor;

			if (total_comps == 3)
			{
				dst_blk.m_low[0].m_c[3] = 127;
				dst_blk.m_high[0].m_c[3] = 127;
			}

			dst_blk.m_pbits[0][0] = best_pbits[0];
			dst_blk.m_pbits[0][1] = best_pbits[1];

			if (mode == 18)
			{
				const uint8_t s_bc7_5_to_4[32] = { 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6, 6, 7, 8, 9, 9, 9, 10, 10, 11, 11, 12, 12, 13, 13, 14, 14, 15, 15 };
				for (uint32_t i = 0; i < 16; i++)
					dst_blk.m_selectors[i] = s_bc7_5_to_4[unpacked_src_blk.m_astc.m_weights[i]];
			}
			else if (mode == 14)
			{
				const uint8_t s_bc7_2_to_4[4] = { 0, 5, 10, 15 };
				for (uint32_t i = 0; i < 16; i++)
					dst_blk.m_selectors[i] = s_bc7_2_to_4[unpacked_src_blk.m_astc.m_weights[i]];
			}
			else if ((mode == 5) || (mode == 12))
			{
				const uint8_t s_bc7_3_to_4[8] = { 0, 2, 4, 6, 9, 11, 13, 15 };
				for (uint32_t i = 0; i < 16; i++)
					dst_blk.m_selectors[i] = s_bc7_3_to_4[unpacked_src_blk.m_astc.m_weights[i]];
			}
			else
			{
				for (uint32_t i = 0; i < 16; i++)
					dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];
			}

			break;
		}
		case 1:
		{
			// DualPlane: 0, WeightRange : 2 (4), Subsets : 1, EndpointRange : 20 (256) - BC7 MODE3
			// Mode 1 uses endpoint range 20 - no need to use ASTC dequant tables.
			dst_blk.m_mode = 3;

			float xl[4], xh[4];
			xl[0] = unpacked_src_blk.m_astc.m_endpoints[0] / 255.0f;
			xl[1] = unpacked_src_blk.m_astc.m_endpoints[2] / 255.0f;
			xl[2] = unpacked_src_blk.m_astc.m_endpoints[4] / 255.0f;
			xl[3] = 1.0f;

			xh[0] = unpacked_src_blk.m_astc.m_endpoints[1] / 255.0f;
			xh[1] = unpacked_src_blk.m_astc.m_endpoints[3] / 255.0f;
			xh[2] = unpacked_src_blk.m_astc.m_endpoints[5] / 255.0f;
			xh[3] = 1.0f;

			uint32_t best_pbits[2];
			color_quad_u8 bestMinColor, bestMaxColor;
			memset(&bestMinColor, 0, sizeof(bestMinColor));
			memset(&bestMaxColor, 0, sizeof(bestMaxColor));
			determine_unique_pbits(3, 7, xl, xh, bestMinColor, bestMaxColor, best_pbits);

			for (uint32_t i = 0; i < 3; i++)
			{
				dst_blk.m_low[0].m_c[i] = bestMinColor.m_c[i];
				dst_blk.m_high[0].m_c[i] = bestMaxColor.m_c[i];
				dst_blk.m_low[1].m_c[i] = bestMinColor.m_c[i];
				dst_blk.m_high[1].m_c[i] = bestMaxColor.m_c[i];
			}
			dst_blk.m_pbits[0][0] = best_pbits[0];
			dst_blk.m_pbits[0][1] = best_pbits[1];
			dst_blk.m_pbits[1][0] = best_pbits[0];
			dst_blk.m_pbits[1][1] = best_pbits[1];

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case 2:
		{
			// 2. DualPlane: 0, WeightRange : 5 (8), Subsets : 2, EndpointRange : 8 (16) - BC7 MODE1 
			dst_blk.m_mode = 1;
			dst_blk.m_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_bc7;

			const bool invert_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_invert;

			float xl[4], xh[4];
			xl[3] = 1.0f;
			xh[3] = 1.0f;

			for (uint32_t subset = 0; subset < 2; subset++)
			{
				for (uint32_t i = 0; i < 3; i++)
				{
					uint32_t v = unpacked_src_blk.m_astc.m_endpoints[i * 2 + subset * 6];
					v = (v << 4) | v;
					xl[i] = v / 255.0f;

					v = unpacked_src_blk.m_astc.m_endpoints[i * 2 + subset * 6 + 1];
					v = (v << 4) | v;
					xh[i] = v / 255.0f;
				}

				uint32_t best_pbits[2] = { 0, 0 };
				color_quad_u8 bestMinColor, bestMaxColor;
				memset(&bestMinColor, 0, sizeof(bestMinColor));
				memset(&bestMaxColor, 0, sizeof(bestMaxColor));
				determine_shared_pbits(3, 6, xl, xh, bestMinColor, bestMaxColor, best_pbits);

				const uint32_t bc7_subset_index = invert_partition ? (1 - subset) : subset;

				for (uint32_t i = 0; i < 3; i++)
				{
					dst_blk.m_low[bc7_subset_index].m_c[i] = bestMinColor.m_c[i];
					dst_blk.m_high[bc7_subset_index].m_c[i] = bestMaxColor.m_c[i];
				}

				dst_blk.m_pbits[bc7_subset_index][0] = best_pbits[0];
			} // subset

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case 3:
		{
			// DualPlane: 0, WeightRange : 2 (4), Subsets : 3, EndpointRange : 7 (12) - BC7 MODE2
			dst_blk.m_mode = 2;
			dst_blk.m_partition = g_astc_bc7_common_partitions3[unpacked_src_blk.m_common_pattern].m_bc7;

			const uint32_t perm = g_astc_bc7_common_partitions3[unpacked_src_blk.m_common_pattern].m_astc_to_bc7_perm;

			for (uint32_t subset = 0; subset < 3; subset++)
			{
				for (uint32_t comp = 0; comp < 3; comp++)
				{
					uint32_t lo = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[comp * 2 + 0 + subset * 6]].m_unquant;
					uint32_t hi = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[comp * 2 + 1 + subset * 6]].m_unquant;

					// TODO: I think this can be improved by using tables like Basis Universal does with ETC1S conversion.
					lo = (lo * 31 + 127) / 255;
					hi = (hi * 31 + 127) / 255;

					const uint32_t bc7_subset_index = g_astc_to_bc7_partition_index_perm_tables[perm][subset];

					dst_blk.m_low[bc7_subset_index].m_c[comp] = (uint8_t)lo;
					dst_blk.m_high[bc7_subset_index].m_c[comp] = (uint8_t)hi;
				}
			}

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case 4:
		{
			// 4. DualPlane: 0, WeightRange: 2 (4), Subsets: 2, EndpointRange: 12 (40) - BC7 MODE3
			dst_blk.m_mode = 3;
			dst_blk.m_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_bc7;

			const bool invert_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_invert;

			float xl[4], xh[4];
			xl[3] = 1.0f;
			xh[3] = 1.0f;

			for (uint32_t subset = 0; subset < 2; subset++)
			{
				for (uint32_t i = 0; i < 3; i++)
				{
					xl[i] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[i * 2 + subset * 6]].m_unquant / 255.0f;
					xh[i] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[i * 2 + subset * 6 + 1]].m_unquant / 255.0f;
				}

				uint32_t best_pbits[2] = { 0, 0 };
				color_quad_u8 bestMinColor, bestMaxColor;
				memset(&bestMinColor, 0, sizeof(bestMinColor));
				memset(&bestMaxColor, 0, sizeof(bestMaxColor));
				determine_unique_pbits(3, 7, xl, xh, bestMinColor, bestMaxColor, best_pbits);

				const uint32_t bc7_subset_index = invert_partition ? (1 - subset) : subset;

				for (uint32_t i = 0; i < 3; i++)
				{
					dst_blk.m_low[bc7_subset_index].m_c[i] = bestMinColor.m_c[i];
					dst_blk.m_high[bc7_subset_index].m_c[i] = bestMaxColor.m_c[i];
				}
				dst_blk.m_low[bc7_subset_index].m_c[3] = 127;
				dst_blk.m_high[bc7_subset_index].m_c[3] = 127;

				dst_blk.m_pbits[bc7_subset_index][0] = best_pbits[0];
				dst_blk.m_pbits[bc7_subset_index][1] = best_pbits[1];

			} // subset

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case 6:
		case 11:
		case 13:
		case 17:
		{
			// MODE 6: DualPlane: 1, WeightRange : 2 (4), Subsets : 1, EndpointRange : 18 (160) - BC7 MODE5 RGB
			// MODE 11: DualPlane: 1, WeightRange: 2 (4), Subsets: 1, EndpointRange: 13 (48) - BC7 MODE5
			// MODE 13: DualPlane: 1, WeightRange: 0 (2), Subsets : 1, EndpointRange : 20 (256) - BC7 MODE5
			// MODE 17: DualPlane: 1, WeightRange: 2 (4), Subsets: 1, CEM: 4 (LA Direct), EndpointRange: 20 (256) - BC7 MODE5
			dst_blk.m_mode = 5;
			dst_blk.m_rotation = (unpacked_src_blk.m_astc.m_ccs + 1) & 3;

			if (total_comps == 2)
			{
				assert(unpacked_src_blk.m_astc.m_ccs == 3);

				dst_blk.m_low->m_c[0] = (uint8_t)((g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0]].m_unquant * 127 + 127) / 255);
				dst_blk.m_high->m_c[0] = (uint8_t)((g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1]].m_unquant * 127 + 127) / 255);

				dst_blk.m_low->m_c[1] = dst_blk.m_low->m_c[0];
				dst_blk.m_high->m_c[1] = dst_blk.m_high->m_c[0];

				dst_blk.m_low->m_c[2] = dst_blk.m_low->m_c[0];
				dst_blk.m_high->m_c[2] = dst_blk.m_high->m_c[0];

				dst_blk.m_low->m_c[3] = (uint8_t)(g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2]].m_unquant);
				dst_blk.m_high->m_c[3] = (uint8_t)(g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3]].m_unquant);
			}
			else
			{
				for (uint32_t astc_comp = 0; astc_comp < 4; astc_comp++)
				{
					uint32_t bc7_comp = astc_comp;
					// ASTC and BC7 handle dual plane component rotations differently:
					// ASTC: 2nd plane separately interpolates the CCS channel.
					// BC7: 2nd plane channel is swapped with alpha, 2nd plane controls alpha interpolation, then we swap alpha with the desired channel.
					if (astc_comp == (uint32_t)unpacked_src_blk.m_astc.m_ccs)
						bc7_comp = 3;
					else if (astc_comp == 3)
						bc7_comp = unpacked_src_blk.m_astc.m_ccs;

					uint32_t l = 255, h = 255;
					if (astc_comp < total_comps)
					{
						l = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[astc_comp * 2 + 0]].m_unquant;
						h = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[astc_comp * 2 + 1]].m_unquant;
					}

					if (bc7_comp < 3)
					{
						l = (l * 127 + 127) / 255;
						h = (h * 127 + 127) / 255;
					}

					dst_blk.m_low->m_c[bc7_comp] = (uint8_t)l;
					dst_blk.m_high->m_c[bc7_comp] = (uint8_t)h;
				}
			}

			if (mode == 13)
			{
				for (uint32_t i = 0; i < 16; i++)
				{
					dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i * 2] ? 3 : 0;
					dst_blk.m_alpha_selectors[i] = unpacked_src_blk.m_astc.m_weights[i * 2 + 1] ? 3 : 0;
				}
			}
			else
			{
				for (uint32_t i = 0; i < 16; i++)
				{
					dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i * 2];
					dst_blk.m_alpha_selectors[i] = unpacked_src_blk.m_astc.m_weights[i * 2 + 1];
				}
			}

			break;
		}
		case 7:
		{
			// DualPlane: 0, WeightRange : 2 (4), Subsets : 2, EndpointRange : 12 (40) - BC7 MODE2
			dst_blk.m_mode = 2;
			dst_blk.m_partition = g_bc7_3_astc2_common_partitions[unpacked_src_blk.m_common_pattern].m_bc73;

			const uint32_t common_pattern_k = g_bc7_3_astc2_common_partitions[unpacked_src_blk.m_common_pattern].k;

			for (uint32_t bc7_part = 0; bc7_part < 3; bc7_part++)
			{
				const uint32_t astc_part = bc7_convert_partition_index_3_to_2(bc7_part, common_pattern_k);

				for (uint32_t c = 0; c < 3; c++)
				{
					dst_blk.m_low[bc7_part].m_c[c] = (g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[c * 2 + 0 + astc_part * 6]].m_unquant * 31 + 127) / 255;
					dst_blk.m_high[bc7_part].m_c[c] = (g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[c * 2 + 1 + astc_part * 6]].m_unquant * 31 + 127) / 255;
				}
			}

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case UASTC_MODE_INDEX_SOLID_COLOR:
		{
			// Void-Extent: Solid Color RGBA (BC7 MODE5 or MODE6)
			const color32& solid_color = unpacked_src_blk.m_solid_color;

			uint32_t best_err0 = g_bc7_mode_6_optimal_endpoints[solid_color.r][0].m_error + g_bc7_mode_6_optimal_endpoints[solid_color.g][0].m_error +
				g_bc7_mode_6_optimal_endpoints[solid_color.b][0].m_error + g_bc7_mode_6_optimal_endpoints[solid_color.a][0].m_error;

			uint32_t best_err1 = g_bc7_mode_6_optimal_endpoints[solid_color.r][1].m_error + g_bc7_mode_6_optimal_endpoints[solid_color.g][1].m_error +
				g_bc7_mode_6_optimal_endpoints[solid_color.b][1].m_error + g_bc7_mode_6_optimal_endpoints[solid_color.a][1].m_error;

			if (best_err0 > 0 && best_err1 > 0)
			{
				dst_blk.m_mode = 5;

				for (uint32_t c = 0; c < 3; c++)
				{
					dst_blk.m_low[0].m_c[c] = g_bc7_mode_5_optimal_endpoints[solid_color.c[c]].m_lo;
					dst_blk.m_high[0].m_c[c] = g_bc7_mode_5_optimal_endpoints[solid_color.c[c]].m_hi;
				}

				memset(dst_blk.m_selectors, BC7ENC_MODE_5_OPTIMAL_INDEX, 16);

				dst_blk.m_low[0].m_c[3] = solid_color.c[3];
				dst_blk.m_high[0].m_c[3] = solid_color.c[3];

				//memset(dst_blk.m_alpha_selectors, 0, 16);
			}
			else
			{
				dst_blk.m_mode = 6;

				uint32_t best_p = 0;
				if (best_err1 < best_err0)
					best_p = 1;

				for (uint32_t c = 0; c < 4; c++)
				{
					dst_blk.m_low[0].m_c[c] = g_bc7_mode_6_optimal_endpoints[solid_color.c[c]][best_p].m_lo;
					dst_blk.m_high[0].m_c[c] = g_bc7_mode_6_optimal_endpoints[solid_color.c[c]][best_p].m_hi;
				}

				dst_blk.m_pbits[0][0] = best_p;
				dst_blk.m_pbits[0][1] = best_p;
				memset(dst_blk.m_selectors, BC7ENC_MODE_6_OPTIMAL_INDEX, 16);
			}

			break;
		}
		case 9:
		case 16:
		{
			// 9. DualPlane: 0, WeightRange : 2 (4), Subsets : 2, EndpointRange : 8 (16) - BC7 MODE7
			// 16. DualPlane: 0, WeightRange: 2 (4), Subsets: 2, CEM: 4 (LA Direct), EndpointRange: 20 (256) - BC7 MODE7

			dst_blk.m_mode = 7;
			dst_blk.m_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_bc7;

			const bool invert_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_invert;

			for (uint32_t astc_subset = 0; astc_subset < 2; astc_subset++)
			{
				float xl[4], xh[4];

				if (total_comps == 2)
				{
					xl[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0 + astc_subset * 4]].m_unquant / 255.0f;
					xh[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1 + astc_subset * 4]].m_unquant / 255.0f;

					xl[1] = xl[0];
					xh[1] = xh[0];

					xl[2] = xl[0];
					xh[2] = xh[0];

					xl[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2 + astc_subset * 4]].m_unquant / 255.0f;
					xh[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3 + astc_subset * 4]].m_unquant / 255.0f;
				}
				else
				{
					xl[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0 + astc_subset * 8]].m_unquant / 255.0f;
					xl[1] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2 + astc_subset * 8]].m_unquant / 255.0f;
					xl[2] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[4 + astc_subset * 8]].m_unquant / 255.0f;
					xl[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[6 + astc_subset * 8]].m_unquant / 255.0f;

					xh[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1 + astc_subset * 8]].m_unquant / 255.0f;
					xh[1] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3 + astc_subset * 8]].m_unquant / 255.0f;
					xh[2] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[5 + astc_subset * 8]].m_unquant / 255.0f;
					xh[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[7 + astc_subset * 8]].m_unquant / 255.0f;
				}

				uint32_t best_pbits[2] = { 0, 0 };
				color_quad_u8 bestMinColor, bestMaxColor;
				memset(&bestMinColor, 0, sizeof(bestMinColor));
				memset(&bestMaxColor, 0, sizeof(bestMaxColor));
				determine_unique_pbits(4, 5, xl, xh, bestMinColor, bestMaxColor, best_pbits);

				const uint32_t bc7_subset_index = invert_partition ? (1 - astc_subset) : astc_subset;

				dst_blk.m_low[bc7_subset_index] = bestMinColor;
				dst_blk.m_high[bc7_subset_index] = bestMaxColor;

				dst_blk.m_pbits[bc7_subset_index][0] = best_pbits[0];
				dst_blk.m_pbits[bc7_subset_index][1] = best_pbits[1];
			} // astc_subset

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		default:
			return false;
		}

		return true;
	}